

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int bitset_container_to_uint32_array(uint32_t *out,bitset_container_t *bc,uint32_t base)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  
  _Var1 = croaring_avx2();
  if ((_Var1) && (0x1fff < (long)bc->cardinality)) {
    sVar3 = bitset_extract_setbits_avx2(bc->words,0x400,out,(long)bc->cardinality,base);
    iVar2 = (int)sVar3;
  }
  else {
    sVar3 = bitset_extract_setbits(bc->words,0x400,out,base);
    iVar2 = (int)sVar3;
  }
  return iVar2;
}

Assistant:

int bitset_container_to_uint32_array(
    uint32_t *out,
    const bitset_container_t *bc,
    uint32_t base
){
#ifdef CROARING_IS_X64
    if(( croaring_avx2() ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx2(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
	else
		return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#else
	return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#endif
}